

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool google::protobuf::internal::WireFormat::SkipMessage
               (CodedInputStream *input,UnknownFieldSet *unknown_fields)

{
  bool bVar1;
  WireType WVar2;
  WireType wire_type;
  uint32_t tag;
  UnknownFieldSet *unknown_fields_local;
  CodedInputStream *input_local;
  uint32_t local_1c;
  uint32_t v;
  uint32_t local_c;
  
  do {
    local_1c = 0;
    if ((input->buffer_ < input->buffer_end_) &&
       (local_1c = (uint32_t)*input->buffer_, local_1c < 0x80)) {
      io::CodedInputStream::Advance(input,1);
      local_c = local_1c;
    }
    else {
      local_c = io::CodedInputStream::ReadTagFallback(input,local_1c);
    }
    input->last_tag_ = local_c;
    if (local_c == 0) {
      return true;
    }
    WVar2 = WireFormatLite::GetTagWireType(local_c);
    if (WVar2 == WIRETYPE_END_GROUP) {
      return true;
    }
    bVar1 = SkipField(input,local_c,unknown_fields);
  } while (bVar1);
  return false;
}

Assistant:

bool WireFormat::SkipMessage(io::CodedInputStream* input,
                             UnknownFieldSet* unknown_fields) {
  while (true) {
    uint32_t tag = input->ReadTag();
    if (tag == 0) {
      // End of input.  This is a valid place to end, so return true.
      return true;
    }

    WireFormatLite::WireType wire_type = WireFormatLite::GetTagWireType(tag);

    if (wire_type == WireFormatLite::WIRETYPE_END_GROUP) {
      // Must be the end of the message.
      return true;
    }

    if (!SkipField(input, tag, unknown_fields)) return false;
  }
}